

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
AddProperty<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance,JavascriptString *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_00;
  BigSimpleDictionaryTypeHandler *this_01;
  SimpleDictionaryPropertyDescriptor<int> *pSVar7;
  JavascriptString **ppJVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int index_00;
  undefined7 in_register_00000081;
  ulong uVar9;
  uint uVar10;
  SimpleDictionaryPropertyDescriptor<int> instance_00;
  JavascriptString *local_60;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  ScriptContext *local_50;
  SimpleDictionaryPropertyDescriptor<int> local_48;
  JavascriptString *local_40;
  JavascriptString *propertyKey_local;
  int index;
  
  propertyKey_local._4_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_50 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)info;
  local_40 = propertyKey;
  bVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::JavascriptString*>
                    (*(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                       **)(this + 0x18),&local_40,
                     (SimpleDictionaryPropertyDescriptor<int> **)&local_60,(int *)&propertyKey_local
                    );
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))",
                                "!propertyMap->TryGetReference(propertyKey, &descriptor)");
    if (!bVar4) goto LAB_00e180f9;
    *puVar6 = 0;
  }
  if (((byte)this[9] & 4) == 0) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00e180f9;
        *puVar6 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
  }
  else {
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)
              SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
              ConvertToNonSharedSimpleDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this
                         ,instance);
  }
  TPropertyKey_IsInternalPropertyId(local_40);
  if (*(int *)(this + 0xc) <= *(int *)(this + 0x2c)) {
    if (0x3ffffffe < *(int *)(this + 0xc)) {
      this_01 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
                ConvertToBigSimpleDictionaryTypeHandler
                          ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
                           this,instance);
      BVar5 = AddProperty<Js::JavascriptString*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_01
                         ,instance,local_40,value,propertyKey_local._4_1_,
                         (PropertyValueInfo *)descriptor,flags,possibleSideEffects);
      return BVar5;
    }
    SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::EnsureSlotCapacity
              (&this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>,
               instance);
  }
  local_48 = (SimpleDictionaryPropertyDescriptor<int>)instance;
  if (value == (Var)0x0 && (char)((flags & PropertyOperation_SpecialValue) >> 4) == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar4) goto LAB_00e180f9;
    *puVar6 = 0;
  }
  if (((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
       super_DynamicTypeHandler.flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar4) goto LAB_00e180f9;
    *puVar6 = 0;
  }
  pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
           singletonInstance.ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((SimpleDictionaryPropertyDescriptor<int>)(pRVar2->super_RecyclerWeakReferenceBase).strongRef
      != local_48)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab1,
                                "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                ,
                                "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                               );
    if (!bVar4) goto LAB_00e180f9;
    *puVar6 = 0;
  }
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    TPropertyKey_IsInternalPropertyId(local_40);
    instance_00 = local_48;
    if ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None) {
      pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
               singletonInstance.ptr;
      if ((pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         ((SimpleDictionaryPropertyDescriptor<int>)
          (pRVar2->super_RecyclerWeakReferenceBase).strongRef != local_48)) {
        uVar9 = 0;
      }
      else {
        bVar4 = VarIs<Js::JavascriptFunction>(value);
        if (bVar4) {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
          uVar9 = CONCAT71(extraout_var,bVar4) & 0xffffffff ^ 1;
        }
        else {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
          if (bVar4) goto LAB_00e17e9d;
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            ((DynamicObject *)instance_00,local_40,value);
          uVar9 = CONCAT71(extraout_var_00,bVar4) & 0xffffffff;
        }
      }
    }
    else {
LAB_00e17e9d:
      uVar9 = 0;
    }
  }
  else {
    uVar9 = 0;
    instance_00 = local_48;
  }
  if (((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
       field_0x28 & 2) != 0) {
    local_48._0_4_ = (int)uVar9;
    bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
            TryReuseDeletedPropertyIndex
                      (this_00,(DynamicObject *)instance_00,(int *)&propertyKey_local);
    uVar9 = (ulong)local_48 & 0xffffffff;
    if (bVar4) {
      pSVar7 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt((this_00->
                            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                            ).propertyMap.ptr,(int)propertyKey_local);
      index_00 = pSVar7->propertyIndex;
      if (pSVar7->propertyIndex != (int)propertyKey_local) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xac0,
                                    "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                    ,
                                    "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                   );
        if (!bVar4) {
LAB_00e180f9:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        index_00 = (int)propertyKey_local;
      }
      ppJVar8 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this_00->
                           super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                           ).propertyMap.ptr,index_00);
      local_60 = *ppJVar8;
      JsUtil::
      BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
      ::Remove((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
               propertyMap.ptr,&local_60);
      uVar10 = propertyKey_local._4_4_;
      Add<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_00,
                 (int)propertyKey_local,local_40,(PropertyAttributes)propertyKey_local._4_4_,
                 (flags & PropertyOperation_PreInit) == PropertyOperation_None,(bool)local_48._0_1_,
                 false,local_50);
      goto LAB_00e17ff0;
    }
  }
  uVar10 = propertyKey_local._4_4_;
  propertyKey_local._0_4_ = *(int *)(this + 0x2c);
  Add<Js::JavascriptString*>
            ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_00,local_40,
             (PropertyAttributes)propertyKey_local._4_4_,
             (flags & PropertyOperation_PreInit) == PropertyOperation_None,SUB81(uVar9,0),false,
             local_50);
LAB_00e17ff0:
  if ((uVar10 & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)instance_00,false);
  }
  DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)instance_00,(int)propertyKey_local,value);
  if (descriptor != (SimpleDictionaryPropertyDescriptor<int> *)0x0) {
    *descriptor = instance_00;
    *(undefined4 *)(descriptor + 1) = 0xffff;
  }
  local_60 = (JavascriptString *)0x0;
  ScriptContext::FindPropertyRecord(local_50,local_40,(PropertyRecord **)&local_60);
  if ((local_60 != (JavascriptString *)0x0) &&
     (uVar10 = *(uint *)&(local_60->super_RecyclableObject).type.ptr, uVar10 != 0xffffffff)) {
    if ((((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
          super_DynamicTypeHandler.flags & 0x20) != 0) ||
       ((0xf < uVar10 &&
        (BVar5 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           ((RecyclableObject *)instance_00,uVar10), BVar5 != 0)))) {
      ScriptContext::InvalidateProtoCaches(local_50,uVar10);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,(DynamicObject *)instance_00,uVar10,value,
               possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }